

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::base::Writer::processDispatch(Writer *this)

{
  pointer pbVar1;
  Logger *pLVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  string_t logMessage;
  char *local_70;
  long local_68;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((*(byte *)(elStorage + 0x18) & 0x80) == 0) {
    if (this->m_proceed == true) {
      triggerDispatch(this);
      return;
    }
    pLVar2 = this->m_logger;
    if (pLVar2 != (Logger *)0x0) {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      std::__cxx11::stringbuf::str((string *)&pLVar2->field_0x58);
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
    }
  }
  else {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = '\0';
    lVar5 = 0x20;
    bVar4 = false;
    uVar3 = 0;
    do {
      if (this->m_proceed == true) {
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&this->m_logger->field_0x50,local_70,local_68);
        }
        else {
          bVar4 = true;
          if (0x20 < (ulong)((long)(this->m_loggerIds).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_loggerIds).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
          }
        }
        triggerDispatch(this);
      }
      else {
        pLVar2 = this->m_logger;
        if (pLVar2 != (Logger *)0x0) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
          std::__cxx11::stringbuf::str((string *)&pLVar2->field_0x58);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
        }
      }
      uVar3 = uVar3 + 1;
      pbVar1 = (this->m_loggerIds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar3 < (ulong)((long)(this->m_loggerIds).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
        initializeLogger(this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5),true,true);
      }
      lVar5 = lVar5 + 0x20;
    } while (uVar3 < (ulong)((long)(this->m_loggerIds).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_loggerIds).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
  }
  return;
}

Assistant:

void Writer::processDispatch() {
#if ELPP_LOGGING_ENABLED
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    bool firstDispatched = false;
    base::type::string_t logMessage;
    std::size_t i = 0;
    do {
      if (m_proceed) {
        if (firstDispatched) {
          m_logger->stream() << logMessage;
        } else {
          firstDispatched = true;
          if (m_loggerIds.size() > 1) {
            logMessage = m_logger->stream().str();
          }
        }
        triggerDispatch();
      } else if (m_logger != nullptr) {
        m_logger->stream().str(ELPP_LITERAL(""));
        m_logger->releaseLock();
      }
      if (i + 1 < m_loggerIds.size()) {
        initializeLogger(m_loggerIds.at(i + 1));
      }
    } while (++i < m_loggerIds.size());
  } else {
    if (m_proceed) {
      triggerDispatch();
    } else if (m_logger != nullptr) {
      m_logger->stream().str(ELPP_LITERAL(""));
      m_logger->releaseLock();
    }
  }
#else
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
#endif // ELPP_LOGGING_ENABLED
}